

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  char *local_20;
  long local_18;
  
  local_20 = id;
  if (id == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmPolicies.cxx"
                  ,0x14,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  sVar2 = strlen(id);
  if ((((sVar2 == 7) && (*id == 'C')) && (id[1] == 'M')) && (id[2] == 'P')) {
    bVar1 = cmHasLiteralSuffix<char_const*,5ul>(&local_20,(char (*) [5])0x50baad);
    if (bVar1) {
      *pid = CMP0000;
    }
    else {
      lVar3 = 0;
      do {
        if (9 < (int)local_20[lVar3 + 3] - 0x30U) goto LAB_003305cd;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      bVar1 = cmSystemTools::StringToLong(local_20 + 3,&local_18);
      if ((!bVar1) || (0x5f < local_18)) goto LAB_003305cd;
      *pid = (PolicyID)local_18;
    }
    bVar1 = true;
  }
  else {
LAB_003305cd:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmPolicies::GetPolicyID(const char* id, cmPolicies::PolicyID& pid)
{
  return stringToId(id, pid);
}